

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_str_append_text_char(nk_str *s,char *str,int len)

{
  int iVar1;
  void *dst0;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2023,"int nk_str_append_text_char(struct nk_str *, const char *, int)");
  }
  if (str != (char *)0x0) {
    if (len == 0) {
      iVar1 = 0;
    }
    else {
      dst0 = nk_buffer_alloc(&s->buffer,NK_BUFFER_FRONT,(long)len,0);
      iVar1 = 0;
      if (dst0 != (void *)0x0) {
        nk_memcopy(dst0,str,(long)len);
        iVar1 = nk_utf_len(str,len);
        s->len = s->len + iVar1;
        iVar1 = len;
      }
    }
    return iVar1;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x2024,"int nk_str_append_text_char(struct nk_str *, const char *, int)");
}

Assistant:

NK_API int
nk_str_append_text_char(struct nk_str *s, const char *str, int len)
{
    char *mem;
    NK_ASSERT(s);
    NK_ASSERT(str);
    if (!s || !str || !len) return 0;
    mem = (char*)nk_buffer_alloc(&s->buffer, NK_BUFFER_FRONT, (nk_size)len * sizeof(char), 0);
    if (!mem) return 0;
    NK_MEMCPY(mem, str, (nk_size)len * sizeof(char));
    s->len += nk_utf_len(str, len);
    return len;
}